

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_cs.c
# Opt level: O0

int jpc_cod_getparms(jpc_ms_t *ms,jpc_cstate_t *cstate,jas_stream_t *in)

{
  int iVar1;
  jpc_cod_t *cod;
  jas_stream_t *in_local;
  jpc_cstate_t *cstate_local;
  jpc_ms_t *ms_local;
  
  iVar1 = jpc_getuint8(in,(uint_fast8_t *)&(ms->parms).soc);
  if ((((iVar1 != 0) || (iVar1 = jpc_getuint8(in,&(ms->parms).cod.prg), iVar1 != 0)) ||
      (iVar1 = jpc_getuint16(in,&(ms->parms).cod.numlyrs), iVar1 != 0)) ||
     (iVar1 = jpc_getuint8(in,&(ms->parms).sot.partno), iVar1 != 0)) {
    return -1;
  }
  if (((ms->parms).sot.len == 0) || (0xffff < (ms->parms).sot.len)) {
    return -1;
  }
  iVar1 = jpc_cox_getcompparms
                    (ms,cstate,in,(uint)(((ms->parms).cod.csty & 1) != 0),&(ms->parms).cod.compparms
                    );
  if (iVar1 != 0) {
    return -1;
  }
  if ((in->flags_ & 1U) == 0) {
    return 0;
  }
  jpc_cod_destroyparms(ms);
  return -1;
}

Assistant:

static int jpc_cod_getparms(jpc_ms_t *ms, jpc_cstate_t *cstate, jas_stream_t *in)
{
	jpc_cod_t *cod = &ms->parms.cod;
	if (jpc_getuint8(in, &cod->csty)) {
		return -1;
	}
	if (jpc_getuint8(in, &cod->prg) ||
	  jpc_getuint16(in, &cod->numlyrs) ||
	  jpc_getuint8(in, &cod->mctrans)) {
		return -1;
	}
	if (cod->numlyrs < 1 || cod->numlyrs > 65535) {
		return -1;
	}
	if (jpc_cox_getcompparms(ms, cstate, in,
	  (cod->csty & JPC_COX_PRT) != 0, &cod->compparms)) {
		return -1;
	}
	if (jas_stream_eof(in)) {
		jpc_cod_destroyparms(ms);
		return -1;
	}
	return 0;
}